

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Opnd * __thiscall
Lowerer::LoadOptimizationOverridesValueOpnd
          (Lowerer *this,Instr *instr,OptimizationOverridesValue valueType)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ScriptContextInfo *pSVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 *puVar5;
  OptimizationOverridesValue valueType_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  switch(valueType) {
  case OptimizationOverridesArraySetElementFastPathVtable:
    pSVar4 = Func::GetScriptContextInfo(this->m_func);
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[0x13])();
    this_local = (Lowerer *)
                 IR::MemRefOpnd::New(CONCAT44(extraout_var_00,iVar3),TyUint64,instr->m_func,
                                     AddrOpndKindDynamicMisc);
    break;
  case OptimizationOverridesIntArraySetElementFastPathVtable:
    pSVar4 = Func::GetScriptContextInfo(this->m_func);
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[0x14])();
    this_local = (Lowerer *)
                 IR::MemRefOpnd::New(CONCAT44(extraout_var_01,iVar3),TyUint64,instr->m_func,
                                     AddrOpndKindDynamicMisc);
    break;
  case OptimizationOverridesFloatArraySetElementFastPathVtable:
    pSVar4 = Func::GetScriptContextInfo(this->m_func);
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[0x15])();
    this_local = (Lowerer *)
                 IR::MemRefOpnd::New(CONCAT44(extraout_var_02,iVar3),TyUint64,instr->m_func,
                                     AddrOpndKindDynamicMisc);
    break;
  case OptimizationOverridesSideEffects:
    pSVar4 = Func::GetScriptContextInfo(this->m_func);
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[0x12])();
    this_local = (Lowerer *)
                 IR::MemRefOpnd::New(CONCAT44(extraout_var,iVar3),TyInt32,instr->m_func,
                                     AddrOpndKindDynamicMisc);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0xcb6,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    this_local = (Lowerer *)0x0;
  }
  return (Opnd *)this_local;
}

Assistant:

IR::Opnd *
Lowerer::LoadOptimizationOverridesValueOpnd(IR::Instr *instr, OptimizationOverridesValue valueType)
{
    switch (valueType)
    {
    case OptimizationOverridesValue::OptimizationOverridesSideEffects:
        return IR::MemRefOpnd::New(m_func->GetScriptContextInfo()->GetSideEffectsAddr(), TyInt32, instr->m_func);
    case OptimizationOverridesValue::OptimizationOverridesArraySetElementFastPathVtable:
        return IR::MemRefOpnd::New(m_func->GetScriptContextInfo()->GetArraySetElementFastPathVtableAddr(), TyMachPtr, instr->m_func);
    case OptimizationOverridesValue::OptimizationOverridesIntArraySetElementFastPathVtable:
        return IR::MemRefOpnd::New(m_func->GetScriptContextInfo()->GetIntArraySetElementFastPathVtableAddr(), TyMachPtr, instr->m_func);
    case OptimizationOverridesValue::OptimizationOverridesFloatArraySetElementFastPathVtable:
        return IR::MemRefOpnd::New(m_func->GetScriptContextInfo()->GetFloatArraySetElementFastPathVtableAddr(), TyMachPtr, instr->m_func);
    default:
        Assert(UNREACHED);
        return nullptr;
    }
}